

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[16],char_const*,char[7],char_const*,char[15],char[74]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [16],char **Args_1,
          char (*Args_2) [7],char **Args_3,char (*Args_4) [15],char (*Args_5) [74])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[16],char_const*,char[7],char_const*,char[15],char[74]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [16])this,(char **)Args,(char (*) [7])Args_1,(char **)Args_2,
             (char (*) [15])Args_3,(char (*) [74])Args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}